

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  ImGuiWindow *window;
  ImDrawList **ppIVar1;
  ImDrawList *pIVar2;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  int n;
  long lVar11;
  ImGuiWindow *pIVar12;
  ulong uVar13;
  ImGuiWindow *pIVar14;
  
  pIVar3 = GImGui;
  iVar6 = GImGui->FrameCountEnded;
  if (iVar6 != GImGui->FrameCount) {
    EndFrame();
    iVar6 = pIVar3->FrameCount;
  }
  pIVar3->FrameCountRendered = iVar6;
  (pIVar3->IO).MetricsRenderWindows = 0;
  (pIVar3->IO).MetricsRenderVertices = 0;
  (pIVar3->IO).MetricsRenderIndices = 0;
  out_list = &pIVar3->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  pIVar14 = pIVar3->NavWindowingTarget;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    pIVar14 = (ImGuiWindow *)0x0;
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar14->Flags & 0x2000) == 0) {
      pIVar14 = pIVar14->RootWindow;
    }
    else {
      pIVar14 = (ImGuiWindow *)0x0;
    }
    pIVar12 = pIVar3->NavWindowingList;
  }
  uVar7 = (pIVar3->Windows).Size;
  if (uVar7 != 0) {
    uVar13 = 0;
    do {
      window = (pIVar3->Windows).Data[uVar13];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar12 && window != pIVar14) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData((ImVector<ImDrawList_*> *)
                              ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                              (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
          uVar7 = (pIVar3->Windows).Size;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar7);
  }
  bVar5 = true;
  do {
    bVar9 = bVar5;
    if (((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->Active == true)) && (pIVar14->Hidden == false)
       ) {
      AddWindowToDrawData((ImVector<ImDrawList_*> *)
                          ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                          (ulong)((uint)pIVar14->Flags >> 0x15 & 0x10)),pIVar14);
    }
    pIVar14 = pIVar12;
    bVar5 = false;
  } while (bVar9);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar3->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar3->OverlayDrawList,(pIVar3->IO).MousePos,
                      (pIVar3->Style).MouseCursorScale,pIVar3->MouseCursor);
  }
  if ((pIVar3->OverlayDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar3->OverlayDrawList);
  }
  pIVar4 = GImGui;
  (pIVar3->DrawData).Valid = true;
  iVar6 = (pIVar3->DrawDataBuilder).Layers[0].Size;
  if ((long)iVar6 < 1) {
    (pIVar3->DrawData).CmdLists = (ImDrawList **)0x0;
    (pIVar3->DrawData).CmdListsCount = iVar6;
    (pIVar3->DrawData).TotalIdxCount = 0;
    (pIVar3->DrawData).TotalVtxCount = 0;
    (pIVar3->DrawData).DisplayPos.x = 0.0;
    (pIVar3->DrawData).DisplayPos.y = 0.0;
    (pIVar3->DrawData).DisplaySize = (pIVar4->IO).DisplaySize;
    (pIVar3->IO).MetricsRenderVertices = 0;
    (pIVar3->IO).MetricsRenderIndices = 0;
  }
  else {
    ppIVar1 = (pIVar3->DrawDataBuilder).Layers[0].Data;
    (pIVar3->DrawData).CmdLists = ppIVar1;
    (pIVar3->DrawData).CmdListsCount = iVar6;
    (pIVar3->DrawData).TotalIdxCount = 0;
    (pIVar3->DrawData).TotalVtxCount = 0;
    (pIVar3->DrawData).DisplayPos.x = 0.0;
    (pIVar3->DrawData).DisplayPos.y = 0.0;
    (pIVar3->DrawData).DisplaySize = (pIVar4->IO).DisplaySize;
    lVar11 = 0;
    iVar8 = 0;
    iVar10 = 0;
    do {
      pIVar2 = ppIVar1[lVar11];
      iVar10 = iVar10 + (pIVar2->VtxBuffer).Size;
      iVar8 = iVar8 + (pIVar2->IdxBuffer).Size;
      lVar11 = lVar11 + 1;
    } while (iVar6 != lVar11);
    (pIVar3->DrawData).TotalVtxCount = iVar10;
    (pIVar3->DrawData).TotalIdxCount = iVar8;
    (pIVar3->IO).MetricsRenderVertices = iVar10;
    (pIVar3->IO).MetricsRenderIndices = iVar8;
    if ((0 < iVar6) &&
       (UNRECOVERED_JUMPTABLE = (pIVar3->IO).RenderDrawListsFn,
       UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0)) {
      (*UNRECOVERED_JUMPTABLE)(&pIVar3->DrawData);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* windows_to_render_front_most[2];
    windows_to_render_front_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_front_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_front_most[0] && window != windows_to_render_front_most[1])
            AddWindowToDrawDataSelectLayer(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_front_most); n++)
        if (windows_to_render_front_most[n] && IsWindowActiveAndVisible(windows_to_render_front_most[n])) // NavWindowingTarget is always temporarily displayed as the front-most window
            AddWindowToDrawDataSelectLayer(windows_to_render_front_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.OverlayDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor);

    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}